

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cmake *pcVar6;
  pointer lff_00;
  bool bVar7;
  cmExecutionStatus status;
  MessageType messType;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace bt;
  cmListFileContext conditionContext;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_1c8;
  MessageType local_1c4;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [16];
  _Elt_pointer pvStack_170;
  _Elt_pointer local_168;
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 local_130 [72];
  undefined1 local_e8 [16];
  undefined1 local_d8 [168];
  
  iVar3 = std::__cxx11::string::compare((char *)lff);
  if (iVar3 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)lff);
    if (iVar3 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_180,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar7 = (_Map_pointer)local_180._0_8_ != (_Map_pointer)0x0;
        if (!bVar7) {
          return bVar7;
        }
        local_1c8.ReturnInvoked = false;
        local_1c8.BreakInvoked = false;
        local_1c8.ContinueInvoked = false;
        local_1c8.NestedError = false;
        lff_00 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_160._24_8_ =
             (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (lff_00 != (pointer)local_160._24_8_) {
          local_160._16_8_ = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
          iVar3 = 0;
          do {
            iVar4 = std::__cxx11::string::compare((char *)lff_00);
            iVar5 = std::__cxx11::string::compare((char *)lff_00);
            iVar3 = (iVar3 + (uint)(iVar4 == 0)) - (uint)(iVar5 == 0);
            if (iVar3 == 0) {
              iVar4 = std::__cxx11::string::compare((char *)lff_00);
              if (iVar4 == 0) {
                if (this->ElseSeen == true) {
                  cmMakefile::GetBacktrace((cmMakefile *)local_130,(cmCommandContext *)mf);
                  pcVar6 = cmMakefile::GetCMakeInstance(mf);
                  local_e8._0_8_ = local_d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e8,
                             "A duplicate ELSE command was found inside an IF block.","");
                  cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_e8,
                                      (cmListFileBacktrace *)local_130);
LAB_001f32de:
                  if ((cmMakefile *)local_e8._0_8_ != (cmMakefile *)local_d8) {
                    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
                  }
                  cmSystemTools::s_FatalErrorOccured = true;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
                  }
                  break;
                }
                bVar2 = this->HasRun;
                this->IsBlocking = bVar2;
                this->HasRun = true;
                this->ElseSeen = true;
                if ((bVar2 == false) &&
                   (pcVar6 = cmMakefile::GetCMakeInstance(mf), pcVar6->Trace == true)) {
                  cmMakefile::PrintCommandTrace(mf,lff_00);
                }
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)lff_00);
                if (iVar4 != 0) goto LAB_001f2efa;
                if (this->ElseSeen == true) {
                  cmMakefile::GetBacktrace((cmMakefile *)local_130,(cmCommandContext *)mf);
                  pcVar6 = cmMakefile::GetCMakeInstance(mf);
                  local_e8._0_8_ = local_d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e8,"An ELSEIF command was found after an ELSE command."
                             ,"");
                  cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_e8,
                                      (cmListFileBacktrace *)local_130);
                  goto LAB_001f32de;
                }
                if (this->HasRun == true) {
                  this->IsBlocking = true;
                }
                else {
                  pcVar6 = cmMakefile::GetCMakeInstance(mf);
                  if (pcVar6->Trace == true) {
                    cmMakefile::PrintCommandTrace(mf,lff_00);
                  }
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  local_1c0._M_string_length = 0;
                  local_1c0.field_2._M_local_buf[0] = '\0';
                  local_168 = (_Elt_pointer)0x0;
                  local_180._8_8_ = 0;
                  pvStack_170 = (_Elt_pointer)0x0;
                  cmMakefile::ExpandArguments
                            (mf,&lff_00->Arguments,
                             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)(local_180 + 8),(char *)0x0);
                  cmListFileContext::FromCommandContext
                            ((cmListFileContext *)local_130,&lff_00->super_cmCommandContext,
                             (string *)local_160._16_8_);
                  cmListFileContext::cmListFileContext
                            ((cmListFileContext *)(local_d8 + 0x60),(cmListFileContext *)local_130);
                  cmMakefile::GetBacktrace((cmMakefile *)local_140,(cmCommandContext *)mf);
                  cmConditionEvaluator::cmConditionEvaluator
                            ((cmConditionEvaluator *)local_e8,mf,
                             (cmListFileContext *)(local_d8 + 0x60),(cmListFileBacktrace *)local_140
                            );
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
                  }
                  cmListFileContext::~cmListFileContext((cmListFileContext *)(local_d8 + 0x60));
                  bVar2 = cmConditionEvaluator::IsTrue
                                    ((cmConditionEvaluator *)local_e8,
                                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                      *)(local_180 + 8),&local_1c0,&local_1c4);
                  if (local_1c0._M_string_length != 0) {
                    cmIfCommandError_abi_cxx11_
                              (&local_1a0,
                               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                *)(local_180 + 8));
                    std::__cxx11::string::_M_append
                              ((char *)&local_1a0,(ulong)local_1c0._M_dataplus._M_p);
                    cmMakefile::GetBacktrace((cmMakefile *)local_160,(cmCommandContext *)mf);
                    pcVar6 = cmMakefile::GetCMakeInstance(mf);
                    cmake::IssueMessage(pcVar6,local_1c4,&local_1a0,(cmListFileBacktrace *)local_160
                                       );
                    if (local_1c4 == FATAL_ERROR) {
                      cmSystemTools::s_FatalErrorOccured = true;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                        operator_delete(local_1a0._M_dataplus._M_p,
                                        local_1a0.field_2._M_allocated_capacity + 1);
                      }
                      cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_e8);
                      cmListFileContext::~cmListFileContext((cmListFileContext *)local_130);
                      std::
                      vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ::~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                 *)(local_180 + 8));
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                        operator_delete(local_1c0._M_dataplus._M_p,
                                        CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                                 local_1c0.field_2._M_local_buf[0]) + 1);
                      }
                      break;
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                      operator_delete(local_1a0._M_dataplus._M_p,
                                      local_1a0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (bVar2) {
                    this->IsBlocking = false;
                    this->HasRun = true;
                  }
                  cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_e8);
                  cmListFileContext::~cmListFileContext((cmListFileContext *)local_130);
                  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ::~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)(local_180 + 8));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                             local_1c0.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
            }
            else {
LAB_001f2efa:
              if (this->IsBlocking == false) {
                local_1c8.ReturnInvoked = false;
                local_1c8.BreakInvoked = false;
                local_1c8.ContinueInvoked = false;
                local_1c8.NestedError = false;
                cmMakefile::ExecuteCommand(mf,lff_00,&local_1c8);
                if (local_1c8.ReturnInvoked == true) {
                  inStatus->ReturnInvoked = true;
                  break;
                }
                if (local_1c8.BreakInvoked == true) {
                  inStatus->BreakInvoked = true;
                  break;
                }
                if (local_1c8.ContinueInvoked == true) {
                  inStatus->ContinueInvoked = true;
                  break;
                }
              }
            }
            lff_00 = lff_00 + 1;
          } while (lff_00 != (pointer)local_160._24_8_);
        }
        if ((_Map_pointer)local_180._0_8_ == (_Map_pointer)0x0) {
          return bVar7;
        }
        (*(code *)(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)local_180._0_8_)[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)();
        return bVar7;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (lff.Name.Lower == "if") {
    this->ScopeDepth++;
  } else if (lff.Name.Lower == "endif") {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (cmListFileFunction const& func : this->Functions) {
        // keep track of scope depth
        if (func.Name.Lower == "if") {
          scopeDepth++;
        }
        if (func.Name.Lower == "endif") {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 && func.Name.Lower == "else") {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(func);
          }
        } else if (scopeDepth == 0 && func.Name.Lower == "elseif") {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(func);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(func.Arguments, expandedArguments);

            MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                func, this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(mf, conditionContext,
                                                    mf.GetBacktrace(func));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(func);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == MessageType::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}